

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvafakebios.c
# Opt level: O2

uint32_t bios_edit_u32(uint8_t *vbios,size_t vbios_length,uint offs,uint32_t new)

{
  ulong uVar1;
  uint32_t uVar2;
  
  uVar1 = (ulong)(offs + 3);
  if (uVar1 < vbios_length) {
    uVar2 = CONCAT13(vbios[uVar1],CONCAT12(vbios[offs + 2],CONCAT11(vbios[offs + 1],vbios[offs])));
    vbios[offs] = (uint8_t)new;
    vbios[offs + 1] = (uint8_t)(new >> 8);
    vbios[offs + 2] = (uint8_t)(new >> 0x10);
    vbios[uVar1] = (uint8_t)(new >> 0x18);
  }
  else {
    uVar2 = 0;
    fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
  }
  return uVar2;
}

Assistant:

uint32_t bios_edit_u32(uint8_t *vbios, size_t vbios_length, unsigned int offs, uint32_t new) {
	uint32_t orig = 0;
	if (offs+3 >= vbios_length) {
		fprintf(stderr, "requested OOB u32 at 0x%04x\n", offs);
		return 0;
	}
	orig = vbios[offs] | vbios[offs+1] << 8 | vbios[offs+2] << 16 | vbios[offs+3] << 24;
	vbios[offs + 0] = (new >> 0) & 0xff;
	vbios[offs + 1] = (new >> 8) & 0xff;
	vbios[offs + 2] = (new >> 16) & 0xff;
	vbios[offs + 3] = (new >> 24) & 0xff;
	return orig;
}